

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_update_layer_context_change_config(AV1_COMP *cpi,int64_t target_bandwidth)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  long in_RSI;
  long *in_RDI;
  double dVar6;
  PRIMARY_RATE_CONTROL *lp_rc;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc_1;
  int tl_1;
  LAYER_CONTEXT *lc;
  int tl;
  int sl;
  int mi_cols;
  int mi_rows;
  float bitrate_alloc;
  int64_t spatial_layer_target;
  int layer;
  SVC *svc;
  AV1_COMMON *cm;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  size_t num;
  int local_64;
  int local_54;
  int local_50;
  float local_44;
  int local_34;
  
  lVar1 = *in_RDI;
  local_34 = 0;
  local_44 = 1.0;
  for (local_50 = 0; local_50 < (int)in_RDI[0x13a67]; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < *(int *)((long)in_RDI + 0x9d33c); local_54 = local_54 + 1) {
      local_34 = local_50 * *(int *)((long)in_RDI + 0x9d33c) + local_54;
      *(undefined8 *)(in_RDI[0x13a91] + (long)local_34 * 0x3380 + 0x3330) =
           *(undefined8 *)(in_RDI[0x13a91] + (long)local_34 * 0x3380 + 0x3320);
    }
    uVar2 = *(undefined8 *)(in_RDI[0x13a91] + (long)local_34 * 0x3380 + 0x3330);
    for (local_64 = 0; local_64 < *(int *)((long)in_RDI + 0x9d33c); local_64 = local_64 + 1) {
      lVar4 = in_RDI[0x13a91] +
              (long)(local_50 * *(int *)((long)in_RDI + 0x9d33c) + local_64) * 0x3380;
      *(undefined8 *)(lVar4 + 0x3338) = uVar2;
      if (in_RSI != 0) {
        local_44 = (float)*(long *)(lVar4 + 0x3330) / (float)in_RSI;
      }
      *(long *)(lVar4 + 0x2280) = (long)((float)*(long *)(lVar1 + 0xac70) * local_44);
      *(long *)(lVar4 + 0x2288) = (long)((float)*(long *)(lVar1 + 0xac78) * local_44);
      *(long *)(lVar4 + 0x2290) = (long)((float)*(long *)(lVar1 + 0xac80) * local_44);
      if (*(long *)(lVar4 + 0x2368) < *(long *)(lVar4 + 0x2290)) {
        num = *(size_t *)(lVar4 + 0x2368);
      }
      else {
        num = *(size_t *)(lVar4 + 0x2290);
      }
      *(size_t *)(lVar4 + 0x2368) = num;
      if (*(long *)(lVar4 + 0x2348) < *(long *)(lVar4 + 0x2290)) {
        pvVar5 = *(void **)(lVar4 + 0x2348);
      }
      else {
        pvVar5 = *(void **)(lVar4 + 0x2290);
      }
      *(void **)(lVar4 + 0x2348) = pvVar5;
      *(double *)(lVar4 + 0x3340) = (double)in_RDI[0xc116] / (double)*(int *)(lVar4 + 0x3318);
      dVar6 = round((double)*(long *)(lVar4 + 0x3330) / *(double *)(lVar4 + 0x3340));
      *(int *)(lVar4 + 0x84) = (int)dVar6;
      *(undefined4 *)(lVar4 + 0x8c) = *(undefined4 *)((long)in_RDI + 0x607fc);
      *(int *)(lVar4 + 0x100) = (int)in_RDI[0xc10e];
      iVar3 = av1_quantizer_to_qindex(*(int *)(lVar4 + 0x334c));
      *(int *)(lVar4 + 0xbc) = iVar3;
      iVar3 = av1_quantizer_to_qindex(*(int *)(lVar4 + 0x3350));
      *(int *)(lVar4 + 0xc0) = iVar3;
      if ((int)in_RDI[0xc115] != 0) {
        *(undefined4 *)(lVar4 + 0xbc) = *(undefined4 *)((long)in_RDI + 0x6082c);
        *(int *)(lVar4 + 0xc0) = (int)in_RDI[0xc106];
      }
      if (((1 < (int)in_RDI[0x13a67]) && (local_64 == 0)) &&
         ((*(long *)(lVar4 + 0x3360) == 0 || ((int)in_RDI[0x13a68] != (int)in_RDI[0x13a67])))) {
        *(undefined4 *)(lVar4 + 0x3358) = 0;
        *(undefined4 *)(lVar4 + 0x3368) = 0;
        *(undefined4 *)(lVar4 + 0x336c) = 0;
        *(undefined4 *)(lVar4 + 0x3370) = 0;
        aom_free(pvVar5);
        pvVar5 = aom_calloc(num,(size_t)pvVar5);
        *(void **)(lVar4 + 0x3360) = pvVar5;
        if (*(long *)(lVar4 + 0x3360) == 0) {
          aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_MEM_ERROR,
                             "Failed to allocate lc->map");
        }
      }
    }
  }
  return;
}

Assistant:

void av1_update_layer_context_change_config(AV1_COMP *const cpi,
                                            const int64_t target_bandwidth) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  AV1_COMMON *const cm = &cpi->common;
  SVC *const svc = &cpi->svc;
  int layer = 0;
  int64_t spatial_layer_target = 0;
  float bitrate_alloc = 1.0;
  const int mi_rows = cm->mi_params.mi_rows;
  const int mi_cols = cm->mi_params.mi_cols;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      svc->layer_context[layer].target_bandwidth = lc->layer_target_bitrate;
    }
    spatial_layer_target = svc->layer_context[layer].target_bandwidth;
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      LAYER_CONTEXT *const lc =
          &svc->layer_context[sl * svc->number_temporal_layers + tl];
      RATE_CONTROL *const lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *const lp_rc = &lc->p_rc;
      lc->spatial_layer_target_bandwidth = spatial_layer_target;
      if (target_bandwidth != 0) {
        bitrate_alloc = (float)lc->target_bandwidth / target_bandwidth;
      }
      lp_rc->starting_buffer_level =
          (int64_t)(p_rc->starting_buffer_level * bitrate_alloc);
      lp_rc->optimal_buffer_level =
          (int64_t)(p_rc->optimal_buffer_level * bitrate_alloc);
      lp_rc->maximum_buffer_size =
          (int64_t)(p_rc->maximum_buffer_size * bitrate_alloc);
      lp_rc->bits_off_target =
          AOMMIN(lp_rc->bits_off_target, lp_rc->maximum_buffer_size);
      lp_rc->buffer_level =
          AOMMIN(lp_rc->buffer_level, lp_rc->maximum_buffer_size);
      lc->framerate = cpi->framerate / lc->framerate_factor;
      lrc->avg_frame_bandwidth =
          (int)round(lc->target_bandwidth / lc->framerate);
      lrc->max_frame_bandwidth = rc->max_frame_bandwidth;
      lrc->rtc_external_ratectrl = rc->rtc_external_ratectrl;
      lrc->worst_quality = av1_quantizer_to_qindex(lc->max_q);
      lrc->best_quality = av1_quantizer_to_qindex(lc->min_q);
      if (rc->use_external_qp_one_pass) {
        lrc->worst_quality = rc->worst_quality;
        lrc->best_quality = rc->best_quality;
      }
      // Reset the cyclic refresh parameters, if needed (map is NULL),
      // or number of spatial layers has changed.
      // Cyclic refresh is only applied on base temporal layer.
      if (svc->number_spatial_layers > 1 && tl == 0 &&
          (lc->map == NULL ||
           svc->prev_number_spatial_layers != svc->number_spatial_layers)) {
        lc->sb_index = 0;
        lc->actual_num_seg1_blocks = 0;
        lc->actual_num_seg2_blocks = 0;
        lc->counter_encode_maxq_scene_change = 0;
        aom_free(lc->map);
        CHECK_MEM_ERROR(cm, lc->map,
                        aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
      }
    }
  }
}